

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O3

ScriptWitness * __thiscall
cfd::core::Transaction::AddScriptWitnessStack
          (ScriptWitness *__return_storage_ptr__,Transaction *this,uint32_t tx_in_index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer pTVar1;
  ByteData local_68;
  ScriptWitness local_50;
  
  AbstractTransaction::AddScriptWitnessStack(&this->super_AbstractTransaction,tx_in_index,data);
  pTVar1 = (this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ByteData::ByteData(&local_68,data);
  AbstractTxIn::AddScriptWitnessStack(&local_50,&pTVar1[tx_in_index].super_AbstractTxIn,&local_68);
  if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,8);
  __return_storage_ptr__->_vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00259cd8;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&__return_storage_ptr__->witness_stack_,&local_50.witness_stack_);
  local_50._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00259cd8;
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_50.witness_stack_);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness Transaction::AddScriptWitnessStack(
    uint32_t tx_in_index, const std::vector<uint8_t> &data) {
  AbstractTransaction::AddScriptWitnessStack(tx_in_index, data);

  const ScriptWitness &witness =
      vin_[tx_in_index].AddScriptWitnessStack(ByteData(data));
  CallbackStateChange(kStateChangeUpdateSignTxIn);
  return witness;
}